

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O0

void la_dgemv_nos(int m,int n,double *a,int lda,double *x,int incx,double *y,int incy)

{
  int local_3c;
  double dStack_38;
  int j;
  double yi;
  int i;
  int incx_local;
  double *x_local;
  int lda_local;
  double *a_local;
  int n_local;
  int m_local;
  
  if (a == (double *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xa2,
                  "void la_dgemv_nos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (x == (double *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xa3,
                  "void la_dgemv_nos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (y == (double *)0x0) {
    __assert_fail("y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xa4,
                  "void la_dgemv_nos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (x != y) {
    if ((lda < 1) || (lda < n)) {
      __assert_fail("lda >= 1 && lda >= n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                    ,0xa6,
                    "void la_dgemv_nos(int, int, const double *, int, const double *, int, double *, int)"
                   );
    }
    if (incx < 1) {
      __assert_fail("incx > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                    ,0xa7,
                    "void la_dgemv_nos(int, int, const double *, int, const double *, int, double *, int)"
                   );
    }
    if (0 < incy) {
      for (yi._0_4_ = 0; yi._0_4_ < n; yi._0_4_ = yi._0_4_ + 1) {
        dStack_38 = 0.0;
        for (local_3c = 0; local_3c < m; local_3c = local_3c + 1) {
          dStack_38 = a[yi._0_4_ * lda + local_3c] * x[local_3c * incx] + dStack_38;
        }
        y[yi._0_4_ * incy] = dStack_38;
      }
      return;
    }
    __assert_fail("incy > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xa8,
                  "void la_dgemv_nos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  __assert_fail("x != y",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,0xa5,
                "void la_dgemv_nos(int, int, const double *, int, const double *, int, double *, int)"
               );
}

Assistant:

void la_dgemv_nos(
        int m, int n,
        const double *a, int lda,
        const double *x, int incx,
        double *y, int incy)
{
    assert(a);
    assert(x);
    assert(y);
    assert(x != y);
    assert(lda >= 1 && lda >= n);
    assert(incx > 0);
    assert(incy > 0);

    for (int i = 0; i < n; i++) {
        double yi = 0.0;
        for (int j = 0; j < m; j++) {
            yi += a[i * lda + j] * x[j * incx];
        }
        y[i * incy] = yi;
    }
}